

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CFG::
walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
          (CFG *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *seen_blocks,uint32_t block,anon_class_16_2_2fc8764d *op)

{
  size_t sVar1;
  uint *puVar2;
  const_iterator cVar3;
  iterator iVar4;
  const_iterator cVar5;
  SmallVector<unsigned_int,_8UL> *pSVar6;
  long lVar7;
  __hashtable *__h;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  local_3c = block;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&seen_blocks->_M_h,&local_3c);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_38 = seen_blocks;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (seen_blocks,
               (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_3c,&local_38);
    local_38._0_4_ = local_3c;
    iVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&op->blocks->_M_h,(key_type_conflict *)&local_38);
    if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      *op->static_loop_init = false;
    }
    local_38 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(local_38._4_4_,local_3c);
    cVar5 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->succeeding_edges)._M_h,(key_type_conflict *)&local_38);
    pSVar6 = &this->empty_vector;
    if (cVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pSVar6 = (SmallVector<unsigned_int,_8UL> *)
               ((long)cVar5.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                      ._M_cur + 0x10);
    }
    sVar1 = (pSVar6->super_VectorView<unsigned_int>).buffer_size;
    if (sVar1 != 0) {
      puVar2 = (pSVar6->super_VectorView<unsigned_int>).ptr;
      lVar7 = 0;
      do {
        walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                  (this,seen_blocks,*(uint32_t *)((long)puVar2 + lVar7),op);
        lVar7 = lVar7 + 4;
      } while (sVar1 << 2 != lVar7);
    }
  }
  return;
}

Assistant:

void walk_from(std::unordered_set<uint32_t> &seen_blocks, uint32_t block, const Op &op) const
	{
		if (seen_blocks.count(block))
			return;
		seen_blocks.insert(block);

		if (op(block))
		{
			for (auto b : get_succeeding_edges(block))
				walk_from(seen_blocks, b, op);
		}
	}